

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O3

bool DeploymentEnabled<Consensus::BuriedDeployment>
               (ChainstateManager *chainman,BuriedDeployment dep)

{
  uint uVar1;
  undefined6 in_register_00000032;
  long in_FS_OFFSET;
  
  uVar1 = (uint)CONCAT62(in_register_00000032,dep);
  if (-0x7ffc < (int)uVar1) {
    __assert_fail("Consensus::ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentstatus.h"
                  ,0x2a,
                  "bool DeploymentEnabled(const Consensus::Params &, Consensus::BuriedDeployment)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return *(int *)((((chainman->m_options).chainparams)->consensus).hashGenesisBlock.
                    super_base_blob<256U>.m_data._M_elems +
                   *(long *)(&DAT_00f99100 + (ulong)(uVar1 & 7) * 8)) != 0x7fffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentEnabled(const ChainstateManager& chainman, DEP dep)
{
    return DeploymentEnabled(chainman.GetConsensus(), dep);
}